

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::InsertTypeTransitionsAtPriorSuccessors
          (BackwardPass *this,BasicBlock *block,BasicBlock *blockSucc,int symId,
          AddPropertyCacheBucket *data,BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  code *pcVar1;
  FlowEdge **this_00;
  bool bVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppFVar4;
  BasicBlock *block_00;
  BasicBlock *blockFix;
  FlowEdge **__edge;
  Iterator __iter;
  BVSparse<Memory::JitArenaAllocator> *upwardExposedUses_local;
  AddPropertyCacheBucket *data_local;
  int symId_local;
  BasicBlock *blockSucc_local;
  BasicBlock *block_local;
  BackwardPass *this_local;
  
  __iter.current = (NodeBase *)upwardExposedUses;
  this_01 = &BasicBlock::GetSuccList(block)->
             super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_01);
  while( true ) {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = __edge;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
    if (bVar2) {
      return;
    }
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppFVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)&__edge);
    block_00 = FlowEdge::GetSucc(*ppFVar4);
    if (block_00 == (BasicBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x17b2,"(blockFix)","blockFix");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (block_00 == blockSucc) break;
    InsertTypeTransitionAtBlock
              (this,block_00,symId,data,(BVSparse<Memory::JitArenaAllocator> *)__iter.current);
  }
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransitionsAtPriorSuccessors(
    BasicBlock *block,
    BasicBlock *blockSucc,
    int symId,
    AddPropertyCacheBucket *data,
    BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    // For each successor of block prior to blockSucc, adjust the type.
    FOREACH_SUCCESSOR_BLOCK(blockFix, block)
    {
        if (blockFix == blockSucc)
        {
            return;
        }

        this->InsertTypeTransitionAtBlock(blockFix, symId, data, upwardExposedUses);
    }
    NEXT_SUCCESSOR_BLOCK;
}